

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChSurfaceNurbs.cpp
# Opt level: O2

void __thiscall
chrono::geometry::ChSurfaceNurbs::SetupData
          (ChSurfaceNurbs *this,int morder_u,int morder_v,ChMatrixDynamic<ChVector<>_> *mpoints,
          ChVectorDynamic<> *mknots_u,ChVectorDynamic<> *mknots_v,ChMatrixDynamic<> *weights)

{
  ChVectorDynamic<> *this_00;
  long lVar1;
  long lVar2;
  Index IVar3;
  int iVar4;
  int iVar5;
  ChException *pCVar6;
  Scalar local_118;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  if (morder_u < 1) {
    pCVar6 = (ChException *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string
              ((string *)&local_50,"ChSurfaceNurbs::SetupData requires u order >= 1.",
               (allocator *)&local_118);
    ChException::ChException(pCVar6,&local_50);
    __cxa_throw(pCVar6,&ChException::typeinfo,ChException::~ChException);
  }
  if (morder_v < 1) {
    pCVar6 = (ChException *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string
              ((string *)&local_70,"ChSurfaceNurbs::SetupData requires v order >= 1.",
               (allocator *)&local_118);
    ChException::ChException(pCVar6,&local_70);
    __cxa_throw(pCVar6,&ChException::typeinfo,ChException::~ChException);
  }
  lVar1 = (mpoints->
          super_PlainObjectBase<Eigen::Matrix<chrono::ChVector<double>,__1,__1,_1,__1,__1>_>).
          m_storage.m_rows;
  if (lVar1 < (long)(ulong)(morder_u + 1)) {
    pCVar6 = (ChException *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string
              ((string *)&local_90,
               "ChSurfaceNurbs::SetupData requires at least (order_u+1)x(order_v+1) control points."
               ,(allocator *)&local_118);
    ChException::ChException(pCVar6,&local_90);
    __cxa_throw(pCVar6,&ChException::typeinfo,ChException::~ChException);
  }
  lVar2 = (mpoints->
          super_PlainObjectBase<Eigen::Matrix<chrono::ChVector<double>,__1,__1,_1,__1,__1>_>).
          m_storage.m_cols;
  if (lVar2 < (long)(ulong)(morder_v + 1)) {
    pCVar6 = (ChException *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string
              ((string *)&local_b0,
               "ChSurfaceNurbs::SetupData requires at least (order_u+1)x(order_v+1) control points."
               ,(allocator *)&local_118);
    ChException::ChException(pCVar6,&local_b0);
    __cxa_throw(pCVar6,&ChException::typeinfo,ChException::~ChException);
  }
  if ((mknots_u != (ChVectorDynamic<> *)0x0) &&
     ((mknots_u->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows !=
      (ulong)(morder_u + 1) + lVar1)) {
    pCVar6 = (ChException *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string
              ((string *)&local_d0,
               "ChSurfaceNurbs::SetupData: knots_u must have size=n_points_u+order_u+1",
               (allocator *)&local_118);
    ChException::ChException(pCVar6,&local_d0);
    __cxa_throw(pCVar6,&ChException::typeinfo,ChException::~ChException);
  }
  if ((mknots_v != (ChVectorDynamic<> *)0x0) &&
     ((mknots_v->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows !=
      (ulong)(morder_v + 1) + lVar2)) {
    pCVar6 = (ChException *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string
              ((string *)&local_f0,
               "ChSurfaceNurbs::SetupData: knots_v must have size=n_points_v+order_v+1",
               (allocator *)&local_118);
    ChException::ChException(pCVar6,&local_f0);
    __cxa_throw(pCVar6,&ChException::typeinfo,ChException::~ChException);
  }
  if ((weights != (ChMatrixDynamic<> *)0x0) &&
     (((weights->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>).m_storage.m_rows
       != lVar1 ||
      ((weights->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>).m_storage.m_cols
       != lVar2)))) {
    pCVar6 = (ChException *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string
              ((string *)&local_110,
               "ChSurfaceNurbs::SetupData: weights matrix must have size as point matrix",
               (allocator *)&local_118);
    ChException::ChException(pCVar6,&local_110);
    __cxa_throw(pCVar6,&ChException::typeinfo,ChException::~ChException);
  }
  this->p_u = morder_u;
  this->p_v = morder_v;
  Eigen::internal::
  call_assignment<Eigen::Matrix<chrono::ChVector<double>,_1,_1,1,_1,_1>,Eigen::Matrix<chrono::ChVector<double>,_1,_1,1,_1,_1>>
            (&this->points,mpoints);
  IVar3 = (this->points).
          super_PlainObjectBase<Eigen::Matrix<chrono::ChVector<double>,__1,__1,_1,__1,__1>_>.
          m_storage.m_cols;
  iVar4 = (int)(this->points).
               super_PlainObjectBase<Eigen::Matrix<chrono::ChVector<double>,__1,__1,_1,__1,__1>_>.
               m_storage.m_rows;
  if (mknots_u == (ChVectorDynamic<> *)0x0) {
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::setZero
              (&(this->knots_u).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,
               (long)(iVar4 + 1 + this->p_u));
    ChBasisToolsBspline::ComputeKnotUniformMultipleEnds(&this->knots_u,this->p_u,0.0,1.0);
  }
  else {
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Matrix<double,_1,1,0,_1,1>>
              (&this->knots_u,mknots_u);
  }
  this_00 = &this->knots_v;
  iVar5 = (int)IVar3;
  if (mknots_v == (ChVectorDynamic<> *)0x0) {
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::setZero
              (&this_00->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,
               (long)(iVar5 + 1 + this->p_v));
    ChBasisToolsBspline::ComputeKnotUniformMultipleEnds(this_00,this->p_v,0.0,1.0);
  }
  else {
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Matrix<double,_1,1,0,_1,1>>
              (this_00,mknots_v);
  }
  if (weights != (ChMatrixDynamic<> *)0x0) {
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,_1,_1,1,_1,_1>,Eigen::Matrix<double,_1,_1,1,_1,_1>>
              (&this->weights,weights);
    return;
  }
  local_118 = 1.0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>::setConstant
            (&(this->weights).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,
             (long)iVar4,(long)iVar5,&local_118);
  return;
}

Assistant:

void ChSurfaceNurbs::SetupData(
    int morder_u,                          // order pu: 1= linear, 2=quadratic, etc.
    int morder_v,                          // order pv: 1= linear, 2=quadratic, etc.
    ChMatrixDynamic<ChVector<>>& mpoints,  // control points, size nuxnv. Required: at least nu >= pu+1, same for v
    ChVectorDynamic<>* mknots_u,  // knots u, size ku. Required ku=nu+pu+1. If not provided, initialized to uniform.
    ChVectorDynamic<>* mknots_v,  // knots v, size kv. Required ku=nu+pu+1. If not provided, initialized to uniform.
    ChMatrixDynamic<>* weights    // weights, size nuxnv. If not provided, all weights as 1.
) {
    if (morder_u < 1)
        throw ChException("ChSurfaceNurbs::SetupData requires u order >= 1.");

    if (morder_v < 1)
        throw ChException("ChSurfaceNurbs::SetupData requires v order >= 1.");

    if (mpoints.rows() < morder_u + 1)
        throw ChException("ChSurfaceNurbs::SetupData requires at least (order_u+1)x(order_v+1) control points.");
    if (mpoints.cols() < morder_v + 1)
        throw ChException("ChSurfaceNurbs::SetupData requires at least (order_u+1)x(order_v+1) control points.");

    if (mknots_u && mknots_u->size() != (mpoints.rows() + morder_u + 1))
        throw ChException("ChSurfaceNurbs::SetupData: knots_u must have size=n_points_u+order_u+1");
    if (mknots_v && mknots_v->size() != (mpoints.cols() + morder_v + 1))
        throw ChException("ChSurfaceNurbs::SetupData: knots_v must have size=n_points_v+order_v+1");

    if (weights && (weights->rows() != mpoints.rows() || weights->cols() != mpoints.cols()))
        throw ChException("ChSurfaceNurbs::SetupData: weights matrix must have size as point matrix");

    this->p_u = morder_u;
    this->p_v = morder_v;
    this->points = mpoints;
    int n_u = (int)points.rows();
    int n_v = (int)points.cols();

    if (mknots_u)
        this->knots_u = *mknots_u;
    else {
        this->knots_u.setZero(n_u + p_u + 1);
        ChBasisToolsBspline::ComputeKnotUniformMultipleEnds(this->knots_u, p_u);
    }
    if (mknots_v)
        this->knots_v = *mknots_v;
    else {
        this->knots_v.setZero(n_v + p_v + 1);
        ChBasisToolsBspline::ComputeKnotUniformMultipleEnds(this->knots_v, p_v);
    }

    if (weights)
        this->weights = *weights;
    else
        this->weights.setConstant(n_u, n_v, 1.0);
}